

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
::AssertNotDebugCapacity
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *this)

{
  size_t sVar1;
  
  sVar1 = capacity(this);
  if (0xffffffffffffff9a < sVar1) {
    sVar1 = capacity(this);
    if (sVar1 == 0xffffffffffffff9c) {
      __assert_fail("capacity() != InvalidCapacity::kReentrance && \"Reentrant container access during element construction/destruction \" \"is not allowed.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf91,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, int>>>::AssertNotDebugCapacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, int>>]"
                   );
    }
    sVar1 = capacity(this);
    if (sVar1 == 0xffffffffffffff9d) {
      __assert_fail("capacity() != InvalidCapacity::kDestroyed && \"Use of destroyed hash table.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf93,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, int>>>::AssertNotDebugCapacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, int>>]"
                   );
    }
  }
  return;
}

Assistant:

void AssertNotDebugCapacity() const {
    if (ABSL_PREDICT_TRUE(capacity() <
                          InvalidCapacity::kAboveMaxValidCapacity)) {
      return;
    }
    assert(capacity() != InvalidCapacity::kReentrance &&
           "Reentrant container access during element construction/destruction "
           "is not allowed.");
    assert(capacity() != InvalidCapacity::kDestroyed &&
           "Use of destroyed hash table.");
    if (SwisstableGenerationsEnabled() &&
        ABSL_PREDICT_FALSE(capacity() >= InvalidCapacity::kMovedFrom)) {
      if (capacity() == InvalidCapacity::kSelfMovedFrom) {
        // If this log triggers, then a hash table was move-assigned to itself
        // and then used again later without being reinitialized.
        ABSL_RAW_LOG(FATAL, "Use of self-move-assigned hash table.");
      }
      ABSL_RAW_LOG(FATAL, "Use of moved-from hash table.");
    }
  }